

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkAbcUtil.c
# Opt level: O3

Lpk_Fun_t * Lpk_FunDup(Lpk_Fun_t *p,uint *pTruth)

{
  uint uVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  undefined8 uVar4;
  uint uVar5;
  Lpk_Fun_t *pLVar6;
  void **ppvVar7;
  byte bVar8;
  ulong uVar9;
  uint nVars;
  
  uVar5 = *(uint *)&p->field_0x8;
  nVars = uVar5 >> 7 & 0x1f;
  bVar8 = (char)nVars - 5;
  if (nVars < 6) {
    bVar8 = 0;
  }
  pLVar6 = (Lpk_Fun_t *)malloc((0xcL << (bVar8 & 0x3f)) + 0xb0);
  pLVar6->puSupps[0] = 0;
  pLVar6->puSupps[1] = 0;
  pLVar6->puSupps[2] = 0;
  pLVar6->puSupps[3] = 0;
  pLVar6->puSupps[4] = 0;
  pLVar6->puSupps[5] = 0;
  pLVar6->puSupps[6] = 0;
  pLVar6->puSupps[7] = 0;
  pLVar6->puSupps[8] = 0;
  pLVar6->puSupps[9] = 0;
  pLVar6->puSupps[10] = 0;
  pLVar6->puSupps[0xb] = 0;
  pLVar6->puSupps[0xc] = 0;
  pLVar6->puSupps[0xd] = 0;
  pLVar6->puSupps[0xe] = 0;
  pLVar6->puSupps[0xf] = 0;
  pLVar6->puSupps[0x10] = 0;
  pLVar6->puSupps[0x11] = 0;
  pLVar6->puSupps[0x12] = 0;
  pLVar6->puSupps[0x13] = 0;
  pLVar6->puSupps[0x14] = 0;
  pLVar6->puSupps[0x15] = 0;
  pLVar6->puSupps[0x16] = 0;
  pLVar6->puSupps[0x17] = 0;
  pLVar6->puSupps[0x18] = 0;
  pLVar6->puSupps[0x19] = 0;
  pLVar6->puSupps[0x1a] = 0;
  pLVar6->puSupps[0x1b] = 0;
  pLVar6->puSupps[0x1c] = 0;
  pLVar6->puSupps[0x1d] = 0;
  pLVar6->puSupps[0x1e] = 0;
  pLVar6->puSupps[0x1f] = 0;
  uVar1 = p->vNodes->nSize;
  pLVar6->vNodes = p->vNodes;
  *(uint *)&pLVar6->field_0x8 = uVar5 & 0x3fffff80 | uVar1 & 0x7f;
  uVar5 = Kit_TruthSupport(pTruth,nVars);
  pLVar6->uSupp = uVar5;
  uVar5 = *(uint *)&p->field_0x8 >> 7 & 0x1f;
  uVar9 = (ulong)(uint)(1 << ((char)uVar5 - 5U & 0x1f));
  if (uVar5 < 6) {
    uVar9 = 1;
  }
  memcpy(pLVar6 + 1,pTruth,uVar9 << 2);
  uVar4 = *(undefined8 *)(p->pFanins + 8);
  *(undefined8 *)pLVar6->pFanins = *(undefined8 *)p->pFanins;
  *(undefined8 *)(pLVar6->pFanins + 8) = uVar4;
  uVar4 = *(undefined8 *)(p->pDelays + 8);
  *(undefined8 *)pLVar6->pDelays = *(undefined8 *)p->pDelays;
  *(undefined8 *)(pLVar6->pDelays + 8) = uVar4;
  pVVar3 = p->vNodes;
  uVar5 = pVVar3->nSize;
  if (uVar5 == pVVar3->nCap) {
    if ((int)uVar5 < 0x10) {
      if (pVVar3->pArray == (void **)0x0) {
        ppvVar7 = (void **)malloc(0x80);
      }
      else {
        ppvVar7 = (void **)realloc(pVVar3->pArray,0x80);
      }
      pVVar3->pArray = ppvVar7;
      pVVar3->nCap = 0x10;
    }
    else {
      if (pVVar3->pArray == (void **)0x0) {
        ppvVar7 = (void **)malloc((ulong)uVar5 << 4);
      }
      else {
        ppvVar7 = (void **)realloc(pVVar3->pArray,(ulong)uVar5 << 4);
      }
      pVVar3->pArray = ppvVar7;
      pVVar3->nCap = uVar5 * 2;
    }
  }
  else {
    ppvVar7 = pVVar3->pArray;
  }
  iVar2 = pVVar3->nSize;
  pVVar3->nSize = iVar2 + 1;
  ppvVar7[iVar2] = pLVar6;
  return pLVar6;
}

Assistant:

Lpk_Fun_t * Lpk_FunDup( Lpk_Fun_t * p, unsigned * pTruth )
{
    Lpk_Fun_t * pNew;
    pNew = Lpk_FunAlloc( p->nVars );
    pNew->Id = Vec_PtrSize(p->vNodes);
    pNew->vNodes = p->vNodes;
    pNew->nVars = p->nVars;
    pNew->nLutK = p->nLutK;
    pNew->nAreaLim = p->nAreaLim;
    pNew->nDelayLim = p->nDelayLim;
    pNew->uSupp = Kit_TruthSupport( pTruth, p->nVars );
    Kit_TruthCopy( Lpk_FunTruth(pNew,0), pTruth, p->nVars );
    memcpy( pNew->pFanins, p->pFanins, 16 );
    memcpy( pNew->pDelays, p->pDelays, 16 );
    Vec_PtrPush( p->vNodes, pNew );
    return pNew;
}